

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.hpp
# Opt level: O0

bool CoreML::Specification::operator==
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *a,
               RepeatedPtrField<CoreML::Specification::FeatureDescription> *b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FeatureDescription *a_00;
  FeatureDescription *b_00;
  int local_24;
  int i;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *b_local;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *a_local;
  
  iVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size(a);
  iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size(b);
  if (iVar2 == iVar3) {
    for (local_24 = 0;
        iVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                          (a), local_24 < iVar2; local_24 = local_24 + 1) {
      a_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[](a,local_24);
      b_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[](b,local_24);
      bVar1 = operator!=(a_00,b_00);
      if (bVar1) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const ::google::protobuf::RepeatedPtrField<T>& a,
                        const ::google::protobuf::RepeatedPtrField<T>& b) {
            if (a.size() != b.size()) {
                return false;
            }
            for (int i=0; i<a.size(); i++) {
                if (a[i] != b[i]) {
                    return false;
                }
            }
            return true;
        }